

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_internal_validate_at(art_t *art,art_ref_t ref,art_internal_validate_t validator)

{
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  _Bool _Var1;
  art_typecode_t aVar2;
  int iVar3;
  art_node_t *paVar4;
  art_t *art_00;
  art_ref_t in_RSI;
  undefined8 in_RDI;
  art_node48_t *unaff_retaddr;
  art_t *in_stack_00000008;
  art_validate_cb_t in_stack_00000010;
  art_internal_validate_t in_stack_00000020;
  art_inner_node_t *inner_node;
  art_leaf_t *leaf;
  undefined8 in_stack_ffffffffffffff98;
  undefined2 uVar5;
  art_key_chunk_t *in_stack_ffffffffffffffa0;
  art_ref_t in_stack_ffffffffffffffa8;
  art_t *in_stack_ffffffffffffffb0;
  art_internal_validate_t *validate;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff98 >> 0x30);
  validate = (art_internal_validate_t *)&stack0x00000008;
  if (in_RSI == 0) {
    _Var1 = art_validate_fail(validate,"node is null");
    return _Var1;
  }
  _Var1 = art_is_leaf(0x10f6f6);
  if (_Var1) {
    paVar4 = art_deref(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar3 = art_compare_prefix((art_key_chunk_t *)in_stack_ffffffffffffffb0,
                               (uint8_t)(in_stack_ffffffffffffffa8 >> 0x38),
                               in_stack_ffffffffffffffa0,(uint8_t)((ushort)uVar5 >> 8),
                               (uint8_t)uVar5);
    if (iVar3 != 0) {
      _Var1 = art_validate_fail(validate,
                                "leaf key does not match its position\'s prefix in the tree");
      return _Var1;
    }
    if ((validate->validate_cb != (art_validate_cb_t)0x0) &&
       (_Var1 = (*validate->validate_cb)
                          (*(art_val_t *)((long)paVar4 + 8),validate->reason,validate->context),
       !_Var1)) {
      if (*validate->reason == (char *)0x0) {
        *validate->reason = "leaf validation failed";
      }
      return false;
    }
  }
  else {
    art_00 = (art_t *)art_deref(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (6 < (int)(validate->depth + (uint)(byte)art_00->root + 1)) {
      _Var1 = art_validate_fail(validate,"node has too much prefix at given depth");
      return _Var1;
    }
    memcpy(validate->current_key + validate->depth,(void *)((long)&art_00->root + 1),
           (ulong)(byte)art_00->root);
    validate->depth = validate->depth + (uint)(byte)art_00->root;
    aVar2 = art_ref_typecode(in_RSI);
    switch(aVar2) {
    case '\x02':
      validator_00.validate_cb._0_7_ = in_stack_fffffffffffffff8;
      validator_00.reason = (char **)in_RDI;
      validator_00.validate_cb._7_1_ = in_stack_ffffffffffffffff;
      validator_00._24_8_ = in_stack_00000008;
      validator_00.context = unaff_retaddr;
      validator_00._32_8_ = in_stack_00000010;
      _Var1 = art_node4_internal_validate(art_00,(art_node4_t *)validate,validator_00);
      if (!_Var1) {
        return false;
      }
      break;
    case '\x03':
      validator_01.validate_cb._0_7_ = in_stack_fffffffffffffff8;
      validator_01.reason = (char **)in_RDI;
      validator_01.validate_cb._7_1_ = in_stack_ffffffffffffffff;
      validator_01._24_8_ = in_stack_00000008;
      validator_01.context = unaff_retaddr;
      validator_01._32_8_ = in_stack_00000010;
      _Var1 = art_node16_internal_validate(art_00,(art_node16_t *)validate,validator_01);
      if (!_Var1) {
        return false;
      }
      break;
    case '\x04':
      _Var1 = art_node48_internal_validate(in_stack_00000008,unaff_retaddr,in_stack_00000020);
      if (!_Var1) {
        return false;
      }
      break;
    case '\x05':
      validator_02.validate_cb._0_7_ = in_stack_fffffffffffffff8;
      validator_02.reason = (char **)in_RDI;
      validator_02.validate_cb._7_1_ = in_stack_ffffffffffffffff;
      validator_02._24_8_ = in_stack_00000008;
      validator_02.context = unaff_retaddr;
      validator_02._32_8_ = in_stack_00000010;
      _Var1 = art_node256_internal_validate(art_00,(art_node256_t *)validate,validator_02);
      if (!_Var1) {
        return false;
      }
      break;
    default:
      _Var1 = art_validate_fail(validate,"invalid node type");
      return _Var1;
    }
  }
  return true;
}

Assistant:

static bool art_internal_validate_at(const art_t *art, art_ref_t ref,
                                     art_internal_validate_t validator) {
    if (ref == CROARING_ART_NULL_REF) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(&validator,
                                     "leaf key does not match its "
                                     "position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf->val, validator.reason,
                                   validator.context)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (art_ref_typecode(ref)) {
            case CROARING_ART_NODE4_TYPE:
                if (!art_node4_internal_validate(art, (art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE16_TYPE:
                if (!art_node16_internal_validate(
                        art, (art_node16_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE48_TYPE:
                if (!art_node48_internal_validate(
                        art, (art_node48_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE256_TYPE:
                if (!art_node256_internal_validate(
                        art, (art_node256_t *)inner_node, validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}